

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall libcellml::Generator::GeneratorImpl::addOriginCommentCode(GeneratorImpl *this)

{
  bool bVar1;
  uint uVar2;
  Profile PVar3;
  element_type *peVar4;
  char *pcVar5;
  byte local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  allocator<char> local_81;
  undefined1 local_80 [8];
  string profileInformation;
  string local_50;
  string local_30;
  GeneratorImpl *local_10;
  GeneratorImpl *this_local;
  
  local_10 = this;
  peVar4 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mProfile);
  GeneratorProfile::commentString_abi_cxx11_(&local_30,peVar4);
  uVar2 = std::__cxx11::string::empty();
  profileInformation.field_2._M_local_buf[0xb] = '\0';
  local_1c1 = 0;
  if ((uVar2 & 1) == 0) {
    peVar4 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::originCommentString_abi_cxx11_(&local_50,peVar4);
    profileInformation.field_2._M_local_buf[0xb] = '\x01';
    local_1c1 = std::__cxx11::string::empty();
    local_1c1 = local_1c1 ^ 0xff;
  }
  if ((profileInformation.field_2._M_local_buf[0xb] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_30);
  if ((local_1c1 & 1) != 0) {
    bVar1 = modifiedProfile(this);
    pcVar5 = "the ";
    if (bVar1) {
      pcVar5 = "a modified ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_80,pcVar5,&local_81);
    std::allocator<char>::~allocator(&local_81);
    peVar4 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    PVar3 = GeneratorProfile::profile(peVar4);
    pcVar5 = "Python";
    if (PVar3 == C) {
      pcVar5 = "C";
    }
    std::__cxx11::string::operator+=((string *)local_80,pcVar5);
    std::__cxx11::string::operator+=((string *)local_80," profile of");
    peVar4 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::commentString_abi_cxx11_(&local_c8,peVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"[CODE]",&local_e9);
    peVar4 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::originCommentString_abi_cxx11_(&local_150,peVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"[PROFILE_INFORMATION]",&local_171);
    replace(&local_130,&local_150,&local_170,(string *)local_80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"[LIBCELLML_VERSION]",&local_199);
    versionString_abi_cxx11_();
    replace(&local_110,&local_130,&local_198,&local_1c0);
    replace(&local_a8,&local_c8,&local_e8,&local_110);
    std::__cxx11::string::operator+=((string *)&this->mCode,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)local_80);
  }
  return;
}

Assistant:

void Generator::GeneratorImpl::addOriginCommentCode()
{
    if (!mProfile->commentString().empty()
        && !mProfile->originCommentString().empty()) {
        std::string profileInformation = modifiedProfile() ?
                                             "a modified " :
                                             "the ";

        profileInformation += (mProfile->profile() == GeneratorProfile::Profile::C) ?
                                  "C" :
                                  "Python";
        profileInformation += " profile of";

        mCode += replace(mProfile->commentString(),
                         "[CODE]", replace(replace(mProfile->originCommentString(), "[PROFILE_INFORMATION]", profileInformation), "[LIBCELLML_VERSION]", versionString()));
    }
}